

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O1

PropStatus __thiscall
spvtools::opt::CCPPass::VisitInstruction(CCPPass *this,Instruction *instr,BasicBlock **dest_bb)

{
  bool bVar1;
  PropStatus PVar2;
  uint32_t uVar3;
  
  *dest_bb = (BasicBlock *)0x0;
  if (instr->opcode_ == OpPhi) {
    PVar2 = VisitPhi(this,instr);
    return PVar2;
  }
  bVar1 = spvOpcodeIsBranch(instr->opcode_);
  if (bVar1) {
    PVar2 = VisitBranch(this,instr,dest_bb);
    return PVar2;
  }
  if (instr->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(instr,(uint)instr->has_type_id_);
    if (uVar3 != 0) {
      PVar2 = VisitAssignment(this,instr);
      return PVar2;
    }
  }
  return kVarying;
}

Assistant:

SSAPropagator::PropStatus CCPPass::VisitInstruction(Instruction* instr,
                                                    BasicBlock** dest_bb) {
  *dest_bb = nullptr;
  if (instr->opcode() == spv::Op::OpPhi) {
    return VisitPhi(instr);
  } else if (instr->IsBranch()) {
    return VisitBranch(instr, dest_bb);
  } else if (instr->result_id()) {
    return VisitAssignment(instr);
  }
  return SSAPropagator::kVarying;
}